

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_3537c6::Db::parseClassEnumType(Db *this)

{
  short *psVar1;
  Node *pNVar2;
  Node *pNVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  
  psVar1 = (short *)this->First;
  if (1 < (ulong)((long)this->Last - (long)psVar1)) {
    if (*psVar1 == 0x7354) {
      pcVar4 = "struct";
      pp_Var5 = (_func_int **)0x197c0d;
    }
    else if (*psVar1 == 0x7554) {
      pcVar4 = "union";
      pp_Var5 = (_func_int **)0x1a979e;
    }
    else {
      if (*psVar1 != 0x6554) goto LAB_00192f5e;
      pcVar4 = "enum";
      pp_Var5 = (_func_int **)0x19d7a5;
    }
    this->First = (char *)(psVar1 + 1);
    pNVar3 = parseName(this,(NameState *)0x0);
    pNVar2 = (Node *)0x0;
    if ((pNVar3 != (Node *)0x0) && (pNVar2 = pNVar3, (_func_int **)pcVar4 != pp_Var5)) {
      pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar2->K = KElaboratedTypeSpefType;
      pNVar2->RHSComponentCache = No;
      pNVar2->ArrayCache = No;
      pNVar2->FunctionCache = No;
      pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4b90;
      pNVar2[1]._vptr_Node = (_func_int **)pcVar4;
      *(_func_int ***)&pNVar2[1].K = pp_Var5;
      pNVar2[2]._vptr_Node = (_func_int **)pNVar3;
    }
    return pNVar2;
  }
LAB_00192f5e:
  pNVar2 = parseName(this,(NameState *)0x0);
  return pNVar2;
}

Assistant:

Node *Db::parseClassEnumType() {
  StringView ElabSpef;
  if (consumeIf("Ts"))
    ElabSpef = "struct";
  else if (consumeIf("Tu"))
    ElabSpef = "union";
  else if (consumeIf("Te"))
    ElabSpef = "enum";

  Node *Name = parseName();
  if (Name == nullptr)
    return nullptr;

  if (!ElabSpef.empty())
    return make<ElaboratedTypeSpefType>(ElabSpef, Name);

  return Name;
}